

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* JSON::parseJSONMap(string *json)

{
  int iVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  ulong in_RSI;
  allocator<char> *in_RDI;
  bool bVar4;
  int i;
  int n;
  string strVal;
  string strKey;
  bool inToken;
  bool hasKey;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *res;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  undefined4 local_18;
  byte local_11;
  ulong local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1144e1);
  pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
  if (*pcVar2 == '{') {
    local_19 = 0;
    local_1a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RDI);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    iVar1 = std::__cxx11::string::size();
    for (iVar5 = 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      if ((local_1a & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
        if (((*pcVar2 != ' ') &&
            (pcVar2 = (char *)std::__cxx11::string::operator[](local_10), *pcVar2 == '\"')) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[](local_10), *pcVar2 != '\\')) {
          local_1a = 1;
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
        if ((*pcVar2 == '\"') &&
           (pcVar2 = (char *)std::__cxx11::string::operator[](local_10), *pcVar2 != '\\')) {
          if ((local_19 & 1) == 0) {
            local_19 = 1;
            do {
              iVar5 = iVar5 + 1;
              pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
            } while (*pcVar2 == ' ');
            do {
              iVar5 = iVar5 + 1;
              pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
            } while (*pcVar2 == ' ');
            pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
            if (*pcVar2 == '[') {
              while (pcVar2 = (char *)std::__cxx11::string::operator[](local_10), *pcVar2 != ']') {
                iVar5 = iVar5 + 1;
                pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
                std::__cxx11::string::operator+=(local_78,*pcVar2);
              }
              std::__cxx11::string::operator+=(local_78,']');
              local_19 = 0;
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff84,iVar1),
                                    (key_type *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
              std::__cxx11::string::operator=((string *)pmVar3,local_78);
              std::__cxx11::string::operator=(local_40,"");
              std::__cxx11::string::operator=(local_78,"");
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
              if (*pcVar2 == '\"') {
                local_1a = 1;
                goto LAB_001149e3;
              }
              while( true ) {
                pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
                bVar4 = false;
                if (*pcVar2 != ',') {
                  pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
                  bVar4 = *pcVar2 != '}';
                }
                if (!bVar4) break;
                iVar5 = iVar5 + 1;
                pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
                std::__cxx11::string::operator+=(local_78,*pcVar2);
              }
              local_19 = 0;
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff84,iVar1),
                                    (key_type *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
              std::__cxx11::string::operator=((string *)pmVar3,local_78);
              std::__cxx11::string::operator=(local_40,"");
              std::__cxx11::string::operator=(local_78,"");
            }
          }
          else {
            local_19 = 0;
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff84,iVar1),
                                  (key_type *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
            std::__cxx11::string::operator=((string *)pmVar3,local_78);
            std::__cxx11::string::operator=(local_40,"");
            std::__cxx11::string::operator=(local_78,"");
          }
          local_1a = 0;
        }
        else if ((local_19 & 1) == 0) {
          pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::operator+=(local_40,*pcVar2);
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::operator+=(local_78,*pcVar2);
        }
      }
LAB_001149e3:
    }
    local_11 = 1;
    local_18 = 1;
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
  }
  else {
    local_11 = 1;
    local_18 = 1;
  }
  if ((local_11 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x114a42);
  }
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

std::map<std::string, std::string> parseJSONMap(const std::string & json) {
    std::map<std::string, std::string> res;
    if (json[0] != '{') return res;

    bool hasKey = false;
    bool inToken = false;

    std::string strKey = "";
    std::string strVal = "";

    int n = json.size();
    for (int i = 1; i < n; ++i) {
        if (!inToken) {
            if (json[i] == ' ') continue;
            if (json[i] == '"' && json[i-1] != '\\') {
                inToken = true;
                continue;
            }
        } else {
            if (json[i] == '"' && json[i-1] != '\\') {
                if (hasKey == false) {
                    hasKey = true;
                    ++i;
                    while (json[i] == ' ') ++i;
                    ++i; // :
                    while (json[i] == ' ') ++i;
                    if (json[i] == '[') {
                        while (json[i] != ']') {
                            strVal += json[i++];
                        }
                        strVal += ']';
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else if (json[i] != '\"') {
                        while (json[i] != ',' && json[i] != '}') {
                            strVal += json[i++];
                        }
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else {
                        inToken = true;
                        continue;
                    }
                } else {
                    hasKey = false;
                    res[strKey] = strVal;
                    strKey = "";
                    strVal = "";
                }
                inToken = false;
                continue;
            }
            if (hasKey == false) {
                strKey += json[i];
            } else {
                strVal += json[i];
            }
        }
    }

    return res;
}